

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qmimetype.cpp
# Opt level: O2

void QMimeType::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QArrayDataPointer<QString> *this;
  qsizetype qVar1;
  Data *pDVar2;
  QString *pQVar3;
  bool bVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (_id == 0 && _c == InvokeMetaMethod) {
    bVar4 = inherits((QMimeType *)_o,(QString *)_a[1]);
    if (*_a != (void *)0x0) {
      *(bool *)*_a = bVar4;
    }
  }
  if ((_c != ReadProperty) || (0xc < (uint)_id)) goto LAB_0045097f;
  this = (QArrayDataPointer<QString> *)*_a;
  switch(_id) {
  case 0:
    *(bool *)&this->d = _o->_vptr_QObject[3] != (_func_int *)0x0;
    goto LAB_0045097f;
  case 1:
    bVar4 = isDefault((QMimeType *)_o);
    *(bool *)&this->d = bVar4;
    goto LAB_0045097f;
  case 2:
    name((QString *)&local_48,(QMimeType *)_o);
    break;
  case 3:
    comment((QString *)&local_48,(QMimeType *)_o);
    break;
  case 4:
    genericIconName((QString *)&local_48,(QMimeType *)_o);
    break;
  case 5:
    iconName((QString *)&local_48,(QMimeType *)_o);
    break;
  case 6:
    globPatterns((QStringList *)&local_48,(QMimeType *)_o);
    goto LAB_0045096c;
  case 7:
    parentMimeTypes((QStringList *)&local_48,(QMimeType *)_o);
    goto LAB_0045096c;
  case 8:
    allAncestors((QStringList *)&local_48,(QMimeType *)_o);
    goto LAB_0045096c;
  case 9:
    aliases((QStringList *)&local_48,(QMimeType *)_o);
    goto LAB_0045096c;
  case 10:
    suffixes((QStringList *)&local_48,(QMimeType *)_o);
LAB_0045096c:
    QArrayDataPointer<QString>::operator=(this,&local_48);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
    goto LAB_0045097f;
  case 0xb:
    preferredSuffix((QString *)&local_48,(QMimeType *)_o);
    break;
  case 0xc:
    filterString((QString *)&local_48,(QMimeType *)_o);
  }
  pDVar2 = this->d;
  pQVar3 = this->ptr;
  this->d = local_48.d;
  this->ptr = local_48.ptr;
  qVar1 = this->size;
  this->size = local_48.size;
  local_48.d = pDVar2;
  local_48.ptr = pQVar3;
  local_48.size = qVar1;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_48);
LAB_0045097f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMimeType::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = reinterpret_cast<QMimeType *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: { bool _r = _t->inherits((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->isValid(); break;
        case 1: *reinterpret_cast<bool*>(_v) = _t->isDefault(); break;
        case 2: *reinterpret_cast<QString*>(_v) = _t->name(); break;
        case 3: *reinterpret_cast<QString*>(_v) = _t->comment(); break;
        case 4: *reinterpret_cast<QString*>(_v) = _t->genericIconName(); break;
        case 5: *reinterpret_cast<QString*>(_v) = _t->iconName(); break;
        case 6: *reinterpret_cast<QStringList*>(_v) = _t->globPatterns(); break;
        case 7: *reinterpret_cast<QStringList*>(_v) = _t->parentMimeTypes(); break;
        case 8: *reinterpret_cast<QStringList*>(_v) = _t->allAncestors(); break;
        case 9: *reinterpret_cast<QStringList*>(_v) = _t->aliases(); break;
        case 10: *reinterpret_cast<QStringList*>(_v) = _t->suffixes(); break;
        case 11: *reinterpret_cast<QString*>(_v) = _t->preferredSuffix(); break;
        case 12: *reinterpret_cast<QString*>(_v) = _t->filterString(); break;
        default: break;
        }
    }
}